

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::genRandomTest
               (Random *rng,BlendState *preCommon,BlendState *postCommon,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers,int maxDrawBufferCount,Context *context)

{
  bool *pbVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 dVar3;
  uint uVar4;
  deBool dVar5;
  float fVar6;
  TextureFormat format;
  IVec2 size;
  BlendState blendState;
  TextureFormat local_148;
  anon_union_8_2_d0736028_for_Maybe<bool>_2 *local_140;
  BlendState *local_138;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *local_130;
  Context *local_128;
  IVec2 local_120;
  BlendState local_118;
  undefined1 *local_b0;
  undefined1 local_a8;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *local_88;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_68;
  
  local_138 = preCommon;
  local_130 = drawBuffers;
  local_128 = context;
  genRandomBlendState(rng,preCommon);
  genRandomBlendState(rng,postCommon);
  if (0 < maxDrawBufferCount) {
    local_140 = &(postCommon->enableBlend).field_1;
    do {
      fVar6 = deRandom_getFloat(&rng->m_rnd);
      local_120.m_data[0] = 0x40;
      local_120.m_data[1] = 0x40;
      ctxType.super_ApiType.m_bits = (ApiType)(*local_128->m_renderCtx->_vptr_RenderContext[2])();
      bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
      dVar3 = deRandom_getUint32(&rng->m_rnd);
      if (bVar2) {
        uVar4 = dVar3 & 0x1f;
      }
      else {
        uVar4 = dVar3 % 0x1b;
      }
      local_148 = glu::mapGLInternalFormat(*(deUint32 *)(&DAT_01ccb8c0 + (ulong)uVar4 * 4));
      local_118.enableBlend.m_ptr = (bool *)0x0;
      local_118.blendEq.m_ptr =
           (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *
           )0x0;
      local_118.blendFunc.m_ptr =
           (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
            *)0x0;
      local_118.colorMask.m_ptr = (Vector<bool,_4> *)0x0;
      genRandomBlendState(rng,&local_118);
      if (local_148.type == FLOAT) {
        pbVar1 = (postCommon->enableBlend).m_ptr;
        if ((pbVar1 != (bool *)0x0) && (*pbVar1 == true)) {
          dVar5 = deRandom_getBool(&rng->m_rnd);
          if (dVar5 == 1) {
            (postCommon->enableBlend).m_ptr = (bool *)0x0;
          }
          else {
            local_a8 = 0;
            local_b0 = &local_a8;
            if ((DrawBufferInfo *)&local_b0 != (DrawBufferInfo *)postCommon) {
              (postCommon->enableBlend).field_1.m_data[0] = '\0';
              (postCommon->enableBlend).m_ptr = (bool *)local_140;
            }
          }
        }
        if (((postCommon->enableBlend).m_ptr == (bool *)0x0) &&
           (((pbVar1 = (local_138->enableBlend).m_ptr, pbVar1 != (bool *)0x0 && (*pbVar1 != false))
            || ((anon_union_8_2_d0736028_for_Maybe<bool>_2 *)local_118.enableBlend.m_ptr !=
                (anon_union_8_2_d0736028_for_Maybe<bool>_2 *)0x0)))) {
          local_118.enableBlend.field_1.m_data[0] = (deUint8  [1])'\0';
          local_118.enableBlend.m_ptr = (bool *)&local_118.enableBlend.field_1;
        }
      }
      DrawBufferInfo::DrawBufferInfo
                ((DrawBufferInfo *)&local_b0,0.1 < fVar6,&local_120,&local_118,&local_148);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
      ::push_back(local_130,(DrawBufferInfo *)&local_b0);
      if (local_68 !=
          (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
           *)0x0) {
        local_68->m_isFirst = true;
        (local_68->field_1).m_first = (BlendFunc *)0x0;
      }
      if (local_88 !=
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          0x0) {
        local_88->m_isFirst = true;
        (local_88->field_1).m_first = (uint *)0x0;
      }
      if (local_118.blendFunc.m_ptr !=
          (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
           *)0x0) {
        (local_118.blendFunc.m_ptr)->m_isFirst = true;
        ((local_118.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
      }
      if (local_118.blendEq.m_ptr !=
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          0x0) {
        (local_118.blendEq.m_ptr)->m_isFirst = true;
        ((local_118.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
      }
      maxDrawBufferCount = maxDrawBufferCount + -1;
    } while (maxDrawBufferCount != 0);
  }
  return;
}

Assistant:

void genRandomTest (de::Random& rng, BlendState& preCommon, BlendState& postCommon, vector<DrawBufferInfo>& drawBuffers, int maxDrawBufferCount, Context& context)
{
	genRandomBlendState(rng, preCommon);
	genRandomBlendState(rng, postCommon);

	for (int drawBufferNdx = 0; drawBufferNdx < maxDrawBufferCount; drawBufferNdx++)
	{
		const bool			render		= rng.getFloat() > 0.1f;
		const IVec2			size		(64, 64);
		const TextureFormat	format		(getRandomFormat(rng, context));
		BlendState			blendState;

		genRandomBlendState(rng, blendState);

		// 32bit float formats don't support blending in GLES32
		if (format.type == tcu::TextureFormat::FLOAT)
		{
			// If format is 32bit float post common can't enable blending
			if (postCommon.enableBlend && *postCommon.enableBlend)
			{
				// Either don't set enable blend or disable blending
				if (rng.getBool())
					postCommon.enableBlend = tcu::nothing<bool>();
				else
					postCommon.enableBlend = tcu::just(false);
			}

			// If post common doesn't disable blending, per attachment state or
			// pre common must.
			if (!postCommon.enableBlend)
			{
				// If pre common enables blend per attachment must disable it
				// If per attachment state changes blend state it must disable it
				if ((preCommon.enableBlend && *preCommon.enableBlend)
					|| blendState.enableBlend)
					blendState.enableBlend = tcu::just(false);
			}
		}

		drawBuffers.push_back(DrawBufferInfo(render, size, blendState, format));
	}
}